

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O1

void re2::RegexpBigConcat(void)

{
  size_t __n;
  int iVar1;
  Regexp *this;
  Regexp **sub;
  Regexp *this_00;
  Regexp *__tmp;
  long lVar2;
  bool bVar3;
  undefined1 *local_1c8;
  size_t local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  char *local_198 [46];
  
  local_1a8._0_8_ = "x";
  local_1a8._8_4_ = 1;
  lVar2 = 0;
  this = Regexp::Parse((StringPiece *)local_1a8,NoParseFlags,(RegexpStatus *)0x0);
  sub = (Regexp **)operator_new(720000);
  do {
    *(Regexp **)((long)sub + lVar2) = this;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 720000);
  lVar2 = 90000;
  do {
    Regexp::Incref(this);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  iVar1 = Regexp::Ref(this);
  if (iVar1 != 0x15f91) {
    LogMessage::LogMessage
              ((LogMessage *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x22,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 8),
               "Check failed: (x->Ref()) == (1 + static_cast<int>(v.size()))",0x3c);
    iVar1 = Regexp::Ref(this);
    std::ostream::operator<<((ostream *)(local_1a8 + 8),iVar1);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a8);
  }
  this_00 = Regexp::Concat(sub,90000,NoParseFlags);
  Regexp::ToString_abi_cxx11_((string *)local_1a8,this_00);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,-0x70);
  __n = CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
  if (__n == local_1c0) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp((void *)local_1a8._0_8_,local_1c8,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if ((char **)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (!bVar3) {
    LogMessage::LogMessage
              ((LogMessage *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x25,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 8),
               "Check failed: (re->ToString()) == (string(v.size(), \'x\'))",0x39);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a8);
  }
  Regexp::Decref(this_00);
  iVar1 = Regexp::Ref(this);
  if (iVar1 != 1) {
    LogMessage::LogMessage
              ((LogMessage *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x27,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 8),"Check failed: (x->Ref()) == (1)",0x1f);
    iVar1 = Regexp::Ref(this);
    std::ostream::operator<<((ostream *)(local_1a8 + 8),iVar1);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a8);
  }
  Regexp::Decref(this);
  operator_delete(sub);
  return;
}

Assistant:

TEST(Regexp, NamedCaptures) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<string, int>* have = x->NamedCaptures();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(2, have->size());  // there are only two named groups in
                               // the regexp: 'g1' and 'g2'.
  map<string, int> want;
  want["g1"] = 1;
  want["g2"] = 3;
  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}